

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<unsigned_long>::Swap
          (RepeatedField<unsigned_long> *this,RepeatedField<unsigned_long> *other)

{
  Arena *pAVar1;
  Arena *pAVar2;
  undefined1 local_28 [8];
  RepeatedField<unsigned_long> temp;
  RepeatedField<unsigned_long> *other_local;
  RepeatedField<unsigned_long> *this_local;
  
  if (this != other) {
    temp.rep_ = (Rep *)other;
    pAVar1 = GetArenaNoVirtual(this);
    pAVar2 = GetArenaNoVirtual((RepeatedField<unsigned_long> *)temp.rep_);
    if (pAVar1 == pAVar2) {
      InternalSwap(this,(RepeatedField<unsigned_long> *)temp.rep_);
    }
    else {
      pAVar1 = GetArenaNoVirtual((RepeatedField<unsigned_long> *)temp.rep_);
      RepeatedField((RepeatedField<unsigned_long> *)local_28,pAVar1);
      MergeFrom((RepeatedField<unsigned_long> *)local_28,this);
      CopyFrom(this,(RepeatedField<unsigned_long> *)temp.rep_);
      UnsafeArenaSwap((RepeatedField<unsigned_long> *)temp.rep_,
                      (RepeatedField<unsigned_long> *)local_28);
      ~RepeatedField((RepeatedField<unsigned_long> *)local_28);
    }
  }
  return;
}

Assistant:

void RepeatedField<Element>::Swap(RepeatedField* other) {
  if (this == other) return;
  if (GetArenaNoVirtual() == other->GetArenaNoVirtual()) {
    InternalSwap(other);
  } else {
    RepeatedField<Element> temp(other->GetArenaNoVirtual());
    temp.MergeFrom(*this);
    CopyFrom(*other);
    other->UnsafeArenaSwap(&temp);
  }
}